

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

int __thiscall
QDockAreaLayout::separatorMove
          (QDockAreaLayout *this,QList<int> *separator,QPoint *origin,QPoint *dest)

{
  uint index;
  ulong uVar1;
  int iVar2;
  QDockAreaLayoutInfo *this_00;
  QList<QLayoutStruct> *_hor_struct_list;
  QList<QLayoutStruct> *hor_struct_list;
  QList<QLayoutStruct> *_ver_struct_list;
  QList<QLayoutStruct> *ver_struct_list;
  long in_FS_OFFSET;
  QList<QLayoutStruct> local_48;
  long local_28;
  
  _hor_struct_list = &local_48;
  _ver_struct_list = &local_48;
  hor_struct_list = &local_48;
  ver_struct_list = &local_48;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (separator->d).size;
  index = (separator->d).ptr[uVar1 - 1];
  if (uVar1 < 2) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (QLayoutStruct *)0x0;
    local_48.d.size = 0;
    if (index < 2) {
      _ver_struct_list = (QList<QLayoutStruct> *)0x0;
    }
    else {
      _hor_struct_list = (QList<QLayoutStruct> *)0x0;
    }
    getGrid(this,_ver_struct_list,_hor_struct_list);
    iVar2 = (dest->yp).m_i - (origin->yp).m_i;
    if (index < 2) {
      iVar2 = (dest->xp).m_i - (origin->xp).m_i;
    }
    iVar2 = separatorMoveHelper(&local_48,(uint)((index & 0xfffffffd) != 0),iVar2,this->sep);
    this->fallbackToSizeHints = false;
    if (index < 2) {
      ver_struct_list = (QList<QLayoutStruct> *)0x0;
    }
    else {
      hor_struct_list = (QList<QLayoutStruct> *)0x0;
    }
    setGrid(this,ver_struct_list,hor_struct_list);
    apply(this,false);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,0x20,0x10);
      }
    }
  }
  else {
    this_00 = info(this,separator);
    iVar2 = (dest->yp).m_i - (origin->yp).m_i;
    if (this_00->o == Horizontal) {
      iVar2 = (dest->xp).m_i - (origin->xp).m_i;
    }
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = QDockAreaLayoutInfo::separatorMove(this_00,index,iVar2);
    }
    QDockAreaLayoutInfo::apply(this_00,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QDockAreaLayout::separatorMove(const QList<int> &separator, const QPoint &origin,
                                                const QPoint &dest)
{
    int delta = 0;
    int index = separator.last();

    if (separator.size() > 1) {
        QDockAreaLayoutInfo *info = this->info(separator);
        delta = pick(info->o, dest - origin);
        if (delta != 0)
            delta = info->separatorMove(index, delta);
        info->apply(false);
        return delta;
    }

    QList<QLayoutStruct> list;

    if (index == QInternal::LeftDock || index == QInternal::RightDock)
        getGrid(nullptr, &list);
    else
        getGrid(&list, nullptr);

    int sep_index = index == QInternal::LeftDock || index == QInternal::TopDock
                        ? 0 : 1;
    Qt::Orientation o = index == QInternal::LeftDock || index == QInternal::RightDock
                        ? Qt::Horizontal
                        : Qt::Vertical;

    delta = pick(o, dest - origin);
    delta = separatorMoveHelper(list, sep_index, delta, sep);

    fallbackToSizeHints = false;

    if (index == QInternal::LeftDock || index == QInternal::RightDock)
        setGrid(nullptr, &list);
    else
        setGrid(&list, nullptr);

    apply(false);

    return delta;
}